

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall
kj::Canceler::AdapterImpl<void>::AdapterImpl
          (AdapterImpl<void> *this,PromiseFulfiller<void> *fulfiller,Canceler *canceler,
          Promise<void> *inner)

{
  AdapterBase *pAVar1;
  PromiseNode *pPVar2;
  PromiseArena *pPVar3;
  _func_int **pp_Var4;
  OwnPromiseNode node;
  AdapterBase *n;
  void *pvVar5;
  PromiseArenaMember *pPVar6;
  OwnPromiseNode local_58;
  PromiseNode *local_50;
  SourceLocation local_48;
  
  (this->super_AdapterBase)._vptr_AdapterBase = (_func_int **)&PTR___cxa_pure_virtual_00644858;
  (this->super_AdapterBase).prev.ptr = &canceler->list;
  (this->super_AdapterBase).next.ptr = (canceler->list).ptr;
  (canceler->list).ptr = &this->super_AdapterBase;
  pAVar1 = (this->super_AdapterBase).next.ptr;
  if (pAVar1 != (AdapterBase *)0x0) {
    (pAVar1->prev).ptr = &(this->super_AdapterBase).next;
  }
  (this->super_AdapterBase)._vptr_AdapterBase = (_func_int **)&PTR_cancel_00644870;
  this->fulfiller = fulfiller;
  pPVar2 = (inner->super_PromiseBase).node.ptr;
  pPVar3 = (pPVar2->super_PromiseArenaMember).arena;
  if (pPVar3 == (PromiseArena *)0x0 || (ulong)((long)pPVar2 - (long)pPVar3) < 0x30) {
    pvVar5 = operator_new(0x400);
    pPVar6 = (PromiseArenaMember *)((long)pvVar5 + 0x3d0);
    *(undefined8 *)((long)pvVar5 + 0x3d8) = 0;
    *(undefined ***)((long)pvVar5 + 0x3d0) = &PTR___cxa_pure_virtual_00644a98;
    *(PromiseNode **)((long)pvVar5 + 0x3e0) = pPVar2;
    (inner->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
    *(code **)((long)pvVar5 + 1000) =
         kj::_::
         TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++:273:11),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++:274:11)>
         ::anon_class_8_1_a7efefcd_for_func::operator();
    (*(pPVar2->super_PromiseArenaMember)._vptr_PromiseArenaMember[2])(pPVar2,(long)pvVar5 + 0x3e0);
    *(undefined ***)((long)pvVar5 + 0x3d0) = &PTR_destroy_00645368;
    *(PromiseFulfiller<void> **)((long)pvVar5 + 0x3f0) = fulfiller;
    *(PromiseFulfiller<void> **)((long)pvVar5 + 0x3f8) = fulfiller;
    *(void **)((long)pvVar5 + 0x3d8) = pvVar5;
  }
  else {
    (pPVar2->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    pPVar6 = &pPVar2[-3].super_PromiseArenaMember;
    pPVar2[-3].super_PromiseArenaMember.arena = (PromiseArena *)0x0;
    pPVar2[-3].super_PromiseArenaMember._vptr_PromiseArenaMember =
         (_func_int **)&PTR___cxa_pure_virtual_00644a98;
    pPVar2[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar2;
    (inner->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
    pPVar2[-2].super_PromiseArenaMember.arena =
         (PromiseArena *)
         kj::_::
         TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++:273:11),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++:274:11)>
         ::anon_class_8_1_a7efefcd_for_func::operator();
    pp_Var4 = pPVar2[-2].super_PromiseArenaMember._vptr_PromiseArenaMember;
    (**(code **)(*pp_Var4 + 0x10))(pp_Var4,pPVar2 + -2);
    pPVar2[-3].super_PromiseArenaMember._vptr_PromiseArenaMember =
         (_func_int **)&PTR_destroy_00645368;
    pPVar2[-1].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)fulfiller;
    pPVar2[-1].super_PromiseArenaMember.arena = (PromiseArena *)fulfiller;
    pPVar2[-3].super_PromiseArenaMember.arena = pPVar3;
  }
  local_48.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
  ;
  local_48.function = "AdapterImpl";
  local_48.lineNumber = 0x110;
  local_48.columnNumber = 0xd;
  local_58.ptr = (PromiseNode *)pPVar6;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::EagerPromiseNode<kj::_::Void>,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_50,&local_58,&local_48);
  node.ptr = local_58.ptr;
  (this->inner).super_PromiseBase.node.ptr = local_50;
  if (&(local_58.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_58.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
  }
  return;
}

Assistant:

Canceler::AdapterImpl<void>::AdapterImpl(kj::PromiseFulfiller<void>& fulfiller,
            Canceler& canceler, kj::Promise<void> inner)
    : AdapterBase(canceler),
      fulfiller(fulfiller),
      inner(inner.then(
          [&fulfiller]() { fulfiller.fulfill(); },
          [&fulfiller](kj::Exception&& e) { fulfiller.reject(kj::mv(e)); })
          .eagerlyEvaluate(nullptr)) {}